

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImLineClosestPoint(ImVec2 *a,ImVec2 *b,ImVec2 *p)

{
  ImVec2 *in_RSI;
  ImVec2 *in_RDI;
  float fVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  float ab_len_sqr;
  float dot;
  ImVec2 ab_dir;
  ImVec2 ap;
  ImVec2 *in_stack_ffffffffffffffa8;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined8 local_8;
  
  IVar2 = operator-(in_stack_ffffffffffffffa8,(ImVec2 *)0x11ac12);
  IVar3 = operator-(in_stack_ffffffffffffffa8,(ImVec2 *)0x11ac27);
  local_28 = IVar2.x;
  local_30 = IVar3.x;
  uStack_24 = IVar2.y;
  uStack_2c = IVar3.y;
  fVar1 = local_28 * local_30 + uStack_24 * uStack_2c;
  if (0.0 <= fVar1) {
    if (fVar1 <= local_30 * local_30 + uStack_2c * uStack_2c) {
      operator*(in_stack_ffffffffffffffa8,0.0);
      operator/(in_stack_ffffffffffffffa8,0.0);
      local_8 = operator+(in_stack_ffffffffffffffa8,(ImVec2 *)0x11acf6);
    }
    else {
      local_8 = *in_RSI;
    }
  }
  else {
    local_8 = *in_RDI;
  }
  return local_8;
}

Assistant:

ImVec2 ImLineClosestPoint(const ImVec2& a, const ImVec2& b, const ImVec2& p)
{
    ImVec2 ap = p - a;
    ImVec2 ab_dir = b - a;
    float dot = ap.x * ab_dir.x + ap.y * ab_dir.y;
    if (dot < 0.0f)
        return a;
    float ab_len_sqr = ab_dir.x * ab_dir.x + ab_dir.y * ab_dir.y;
    if (dot > ab_len_sqr)
        return b;
    return a + ab_dir * dot / ab_len_sqr;
}